

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

int PHYSFS_delete(char *_fname)

{
  void *pvVar1;
  _func_int_void_ptr_char_ptr *p_Var2;
  undefined8 uVar3;
  DirHandle *pDVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  char *dst;
  char **ppcVar9;
  undefined8 *puVar10;
  undefined1 *ptr;
  undefined8 uStack_30;
  char *local_28;
  
  ppcVar9 = &local_28;
  if (_fname == (char *)0x0) {
    puVar10 = &uStack_30;
    uStack_30 = 9;
  }
  else {
    uStack_30 = 0x10831a;
    sVar8 = strlen(_fname);
    if (sVar8 + 1 < 0x100) {
      ppcVar9 = (char **)((long)&local_28 - (sVar8 + 0x18 & 0xfffffffffffffff0));
      ptr = (undefined1 *)ppcVar9;
    }
    else {
      ptr = (undefined1 *)0x0;
    }
    *(undefined8 *)((long)ppcVar9 + -8) = 0x108345;
    dst = (char *)__PHYSFS_initSmallAlloc(ptr,sVar8 + 1);
    if (dst != (char *)0x0) {
      local_28 = dst;
      *(undefined8 *)((long)ppcVar9 + -8) = 0x10835c;
      iVar6 = sanitizePlatformIndependentPath(_fname,dst);
      if (iVar6 == 0) {
        iVar6 = 0;
      }
      else {
        *(undefined8 *)((long)ppcVar9 + -8) = 0x10836c;
        __PHYSFS_platformGrabMutex(stateLock);
        pDVar4 = writeDir;
        if (writeDir == (DirHandle *)0x0) {
          *(undefined8 *)((long)ppcVar9 + -8) = 0xd;
          uVar3 = *(undefined8 *)((long)ppcVar9 + -8);
          *(undefined8 *)((long)ppcVar9 + -8) = 0x1083ba;
          PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar3);
          iVar6 = 0;
        }
        else {
          iVar6 = 0;
          *(undefined8 *)((long)ppcVar9 + -8) = 0x108389;
          iVar7 = verifyPath(writeDir,&local_28,0);
          pcVar5 = local_28;
          if (iVar7 != 0) {
            pvVar1 = pDVar4->opaque;
            p_Var2 = pDVar4->funcs->remove;
            *(undefined8 *)((long)ppcVar9 + -8) = 0x10839b;
            iVar6 = (*p_Var2)(pvVar1,pcVar5);
          }
        }
        *(undefined8 *)((long)ppcVar9 + -8) = 0x1083c9;
        __PHYSFS_platformReleaseMutex(stateLock);
      }
      if (*(long *)(dst + -8) == 0) {
        return iVar6;
      }
      *(undefined8 *)((long)ppcVar9 + -8) = 0x1083dd;
      (*__PHYSFS_AllocatorHooks.Free)(dst + -8);
      return iVar6;
    }
    puVar10 = (undefined8 *)((long)ppcVar9 + -8);
    *(undefined8 *)((long)ppcVar9 + -8) = 2;
  }
  uVar3 = *puVar10;
  *puVar10 = 0x1083a8;
  PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar3);
  return 0;
}

Assistant:

int PHYSFS_delete(const char *_fname)
{
    int retval;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    len = strlen(_fname) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!fname, PHYSFS_ERR_OUT_OF_MEMORY, 0);
    retval = doDelete(_fname, fname);
    __PHYSFS_smallFree(fname);
    return retval;
}